

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitu.c
# Opt level: O1

void missmu(monst *mtmp,boolean nearmiss,attack *mattk)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  char *line;
  
  if (mtmp->wormno == '\0') {
    if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
        (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0 && ((mtmp->data->mflags3 & 0x200) != 0))))))
    goto LAB_001cfe59;
  }
  else {
    bVar2 = worm_known(level,mtmp);
    if (bVar2 != '\0') {
LAB_001cfe59:
      uVar1 = *(uint *)&mtmp->field_0x60;
      if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar1 & 0x280) == 0) goto LAB_001cfea2;
      }
      else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001cfea2:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001d002d;
      }
    }
  }
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar4 = which_armor(mtmp,4), poVar4 != (obj *)0x0 &&
        (poVar4 = which_armor(mtmp,4), poVar4->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar2 = match_warn_of_mon(mtmp), bVar2 == '\0')))) {
    map_invisible(mtmp->mx,mtmp->my);
  }
LAB_001d002d:
  iVar3 = could_seduce(mtmp,&youmonst,mattk);
  bVar2 = flags.verbose;
  if ((iVar3 == 0) || ((mtmp->field_0x61 & 1) != 0)) {
    pcVar5 = Monnam(mtmp);
    if ((nearmiss == '\0') || (bVar2 == '\0')) {
      line = "%s misses.";
    }
    else {
      line = "%s just misses!";
    }
  }
  else {
    pcVar5 = Monnam(mtmp);
    line = "%s pretends to be friendly.";
  }
  pline(line,pcVar5);
  stop_occupation();
  return;
}

Assistant:

static void missmu(struct monst *mtmp, boolean nearmiss, const struct attack *mattk)
{
	if (!canspotmon(level, mtmp))
	    map_invisible(mtmp->mx, mtmp->my);

	if (could_seduce(mtmp, &youmonst, mattk) && !mtmp->mcan)
	    pline("%s pretends to be friendly.", Monnam(mtmp));
	else {
	    if (!flags.verbose || !nearmiss)
		pline("%s misses.", Monnam(mtmp));
	    else
		pline("%s just misses!", Monnam(mtmp));
	}
	stop_occupation();
}